

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hammersley.cpp
# Opt level: O0

void __thiscall pm::Hammersley::generateSamples(Hammersley *this)

{
  uint uVar1;
  ulong uVar2;
  float yy;
  Vector2 local_20;
  Vector2 pv;
  uint j;
  uint p;
  Hammersley *this_local;
  
  for (pv.y = 0.0; (uint)pv.y < (this->super_Sampler).numSets_; pv.y = (float)((int)pv.y + 1)) {
    for (pv.x = 0.0; (uint)pv.x < (this->super_Sampler).numSamples_; pv.x = (float)((int)pv.x + 1))
    {
      uVar2 = (ulong)(uint)pv.x;
      uVar1 = (this->super_Sampler).numSamples_;
      yy = anon_unknown_5::phi((uint)pv.x);
      Vector2::Vector2(&local_20,(float)uVar2 / (float)uVar1,yy);
      std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::push_back
                (&(this->super_Sampler).samples_,&local_20);
    }
  }
  return;
}

Assistant:

void Hammersley::generateSamples()
{
	for (unsigned int p = 0; p < numSets_; p++)
	{
		for (unsigned int j = 0; j < numSamples_; j++)
		{
			const Vector2 pv(static_cast<float>(j) / static_cast<float>(numSamples_), phi(j));
			samples_.push_back(pv);
		}
	}
}